

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

string * pfederc::logCreateErrorMessage
                   (string *__return_storage_ptr__,Lexer *lexer,Position *pos,string *msg)

{
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *msg_local;
  Position *pos_local;
  Lexer *lexer_local;
  
  local_28 = msg;
  msg_local = (string *)pos;
  pos_local = (Position *)lexer;
  lexer_local = (Lexer *)__return_storage_ptr__;
  _logLexerErrorBase_abi_cxx11_(&local_88,lexer,pos);
  std::operator+(&local_68,&local_88,local_28);
  std::operator+(&local_48,&local_68,"\n");
  _logLexerErrorMark_abi_cxx11_(&local_a8,(Lexer *)pos_local,(Position *)msg_local);
  std::operator+(__return_storage_ptr__,&local_48,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string pfederc::logCreateErrorMessage(const Lexer &lexer, const Position &pos, const std::string &msg) noexcept {
  return _logLexerErrorBase(lexer, pos) + msg + "\n" + _logLexerErrorMark(lexer, pos);
}